

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

UBool __thiscall
icu_63::NFRule::doParse
          (NFRule *this,UnicodeString *text,ParsePosition *parsePosition,UBool isFractionRule,
          double upperBound,uint32_t nonNumericalExecutedRuleMask,Formattable *resVal)

{
  short sVar1;
  long lVar2;
  undefined4 uVar3;
  int iVar4;
  int32_t srcStart;
  undefined2 uVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  undefined7 in_register_00000009;
  undefined4 uVar9;
  int32_t srcStart_00;
  int32_t srcLength;
  int32_t startPos;
  double dVar10;
  ParsePosition pp;
  ParsePosition pp2;
  UnicodeString workText;
  UnicodeString workText2;
  UnicodeString temp;
  UnicodeString prefix;
  int local_1b4;
  ParsePosition local_1a0;
  double local_190;
  uint32_t local_184;
  UnicodeString *local_180;
  undefined4 local_178;
  int local_174;
  ParsePosition local_170;
  UObject local_160;
  double local_158;
  double local_150;
  Formattable *local_148;
  _func_int **local_140;
  double local_138;
  UnicodeString local_130;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_140 = (_func_int **)&PTR__ParsePosition_003ab3a0;
  local_1a0.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003ab3a0;
  local_1a0.index = 0;
  local_1a0.errorIndex = -1;
  local_184 = nonNumericalExecutedRuleMask;
  local_150 = upperBound;
  UnicodeString::UnicodeString(&local_130,text);
  if (this->sub1 == (NFSubstitution *)0x0) {
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      srcLength = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      srcLength = (int)sVar1 >> 5;
    }
  }
  else {
    srcLength = this->sub1->pos;
  }
  if (this->sub2 == (NFSubstitution *)0x0) {
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      srcStart_00 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      srcStart_00 = (int)sVar1 >> 5;
    }
  }
  else {
    srcStart_00 = this->sub2->pos;
  }
  local_160._vptr_UObject = (_func_int **)&PTR__UnicodeString_003b2258;
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::unBogus(&local_70);
  local_180 = &this->fRuleText;
  if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
    local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doReplace(&local_70,0,local_70.fUnion.fFields.fLength,local_180,0,srcLength);
  stripPrefix(this,&local_130,&local_70,&local_1a0);
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  uVar7 = local_130.fUnion.fFields.fLength;
  if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
    uVar7 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (srcLength == 0 || local_1a0.index != 0) {
    lVar2 = this->baseValue;
    if (lVar2 == -6) {
      parsePosition->index = local_1a0.index;
      dVar10 = uprv_getNaN_63();
    }
    else {
      if (lVar2 != -5) {
        local_178 = (undefined4)CONCAT71(in_register_00000009,isFractionRule);
        local_190 = 0.0;
        local_158 = 0.0;
        if (0 < lVar2) {
          local_158 = (double)lVar2;
        }
        local_b0.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)(UObject)local_160._vptr_UObject;
        local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
        local_174 = srcStart_00 - srcLength;
        local_1b4 = 0;
        startPos = 0;
        local_148 = resVal;
        while( true ) {
          local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffff00000000;
          UnicodeString::unBogus(&local_b0);
          uVar9 = local_b0.fUnion.fFields.fLength;
          if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
            uVar9 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          UnicodeString::doReplace(&local_b0,0,uVar9,local_180,srcLength,local_174);
          local_138 = matchToDelimiter(this,&local_130,startPos,local_158,&local_b0,&local_1a0,
                                       this->sub1,local_184,local_150);
          uVar9 = local_130.fUnion.fFields.fLength;
          uVar5 = local_130.fUnion.fStackFields.fLengthAndFlags;
          srcStart = local_1a0.index;
          if ((local_1a0.index == 0) && (this->sub1 != (NFSubstitution *)0x0)) {
            if (parsePosition->errorIndex < local_1a0.errorIndex + srcLength) {
              parsePosition->errorIndex = local_1a0.errorIndex + srcLength;
            }
          }
          else {
            local_f0.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)(UObject)local_160._vptr_UObject;
            local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
            UnicodeString::unBogus(&local_f0);
            uVar3 = (int)(short)uVar5 >> 5;
            if ((short)uVar5 < 0) {
              uVar3 = uVar9;
            }
            uVar9 = local_f0.fUnion.fFields.fLength;
            if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
              uVar9 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            UnicodeString::doReplace(&local_f0,0,uVar9,&local_130,srcStart,uVar3 - srcStart);
            local_170.super_UObject._vptr_UObject = local_140;
            local_170.index = 0;
            local_170.errorIndex = -1;
            sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
            iVar8 = (this->fRuleText).fUnion.fFields.fLength;
            UnicodeString::unBogus(&local_b0);
            iVar4 = (int)sVar1 >> 5;
            if (sVar1 < 0) {
              iVar4 = iVar8;
            }
            uVar9 = local_b0.fUnion.fFields.fLength;
            if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
              uVar9 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            UnicodeString::doReplace(&local_b0,0,uVar9,local_180,srcStart_00,iVar4 - srcStart_00);
            dVar10 = matchToDelimiter(this,&local_f0,0,local_138,&local_b0,&local_170,this->sub2,
                                      local_184,local_150);
            if ((local_170.index == 0) && (this->sub2 != (NFSubstitution *)0x0)) {
              iVar8 = local_170.errorIndex + srcLength + local_1a0.index;
              if (parsePosition->errorIndex < iVar8) {
                parsePosition->errorIndex = iVar8;
              }
            }
            else {
              iVar8 = local_170.index + (iVar6 - uVar7) + local_1a0.index;
              if (local_1b4 < iVar8) {
                local_1b4 = iVar8;
                local_190 = dVar10;
              }
            }
            ParsePosition::~ParsePosition(&local_170);
            UnicodeString::~UnicodeString(&local_f0);
            startPos = srcStart;
          }
          if ((srcStart_00 == srcLength) || (local_1a0.index < 1)) break;
          uVar9 = local_130.fUnion.fFields.fLength;
          if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
            uVar9 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (((int)uVar9 <= local_1a0.index) || (local_1a0.index == startPos)) break;
        }
        parsePosition->index = local_1b4;
        if (0 < local_1b4) {
          parsePosition->errorIndex = 0;
        }
        dVar10 = local_190;
        if (this->sub1 == (NFSubstitution *)0x0) {
          dVar10 = 1.0 / local_190;
        }
        if (local_1b4 < 1) {
          dVar10 = local_190;
        }
        if ((char)local_178 == '\0') {
          dVar10 = local_190;
        }
        Formattable::setDouble(local_148,dVar10);
        UnicodeString::~UnicodeString(&local_b0);
        goto LAB_0024f7cb;
      }
      parsePosition->index = local_1a0.index;
      dVar10 = uprv_getInfinity_63();
    }
    Formattable::setDouble(resVal,dVar10);
  }
  else {
    parsePosition->errorIndex = local_1a0.errorIndex;
    Formattable::setLong(resVal,0);
  }
LAB_0024f7cb:
  UnicodeString::~UnicodeString(&local_70);
  UnicodeString::~UnicodeString(&local_130);
  ParsePosition::~ParsePosition(&local_1a0);
  return '\x01';
}

Assistant:

UBool
NFRule::doParse(const UnicodeString& text,
                ParsePosition& parsePosition,
                UBool isFractionRule,
                double upperBound,
                uint32_t nonNumericalExecutedRuleMask,
                Formattable& resVal) const
{
    // internally we operate on a copy of the string being parsed
    // (because we're going to change it) and use our own ParsePosition
    ParsePosition pp;
    UnicodeString workText(text);

    int32_t sub1Pos = sub1 != NULL ? sub1->getPos() : fRuleText.length();
    int32_t sub2Pos = sub2 != NULL ? sub2->getPos() : fRuleText.length();

    // check to see whether the text before the first substitution
    // matches the text at the beginning of the string being
    // parsed.  If it does, strip that off the front of workText;
    // otherwise, dump out with a mismatch
    UnicodeString prefix;
    prefix.setTo(fRuleText, 0, sub1Pos);

#ifdef RBNF_DEBUG
    fprintf(stderr, "doParse %p ", this);
    {
        UnicodeString rt;
        _appendRuleText(rt);
        dumpUS(stderr, rt);
    }

    fprintf(stderr, " text: '");
    dumpUS(stderr, text);
    fprintf(stderr, "' prefix: '");
    dumpUS(stderr, prefix);
#endif
    stripPrefix(workText, prefix, pp);
    int32_t prefixLength = text.length() - workText.length();

#ifdef RBNF_DEBUG
    fprintf(stderr, "' pl: %d ppi: %d s1p: %d\n", prefixLength, pp.getIndex(), sub1Pos);
#endif

    if (pp.getIndex() == 0 && sub1Pos != 0) {
        // commented out because ParsePosition doesn't have error index in 1.1.x
        // restored for ICU4C port
        parsePosition.setErrorIndex(pp.getErrorIndex());
        resVal.setLong(0);
        return TRUE;
    }
    if (baseValue == kInfinityRule) {
        // If you match this, don't try to perform any calculations on it.
        parsePosition.setIndex(pp.getIndex());
        resVal.setDouble(uprv_getInfinity());
        return TRUE;
    }
    if (baseValue == kNaNRule) {
        // If you match this, don't try to perform any calculations on it.
        parsePosition.setIndex(pp.getIndex());
        resVal.setDouble(uprv_getNaN());
        return TRUE;
    }

    // this is the fun part.  The basic guts of the rule-matching
    // logic is matchToDelimiter(), which is called twice.  The first
    // time it searches the input string for the rule text BETWEEN
    // the substitutions and tries to match the intervening text
    // in the input string with the first substitution.  If that
    // succeeds, it then calls it again, this time to look for the
    // rule text after the second substitution and to match the
    // intervening input text against the second substitution.
    //
    // For example, say we have a rule that looks like this:
    //    first << middle >> last;
    // and input text that looks like this:
    //    first one middle two last
    // First we use stripPrefix() to match "first " in both places and
    // strip it off the front, leaving
    //    one middle two last
    // Then we use matchToDelimiter() to match " middle " and try to
    // match "one" against a substitution.  If it's successful, we now
    // have
    //    two last
    // We use matchToDelimiter() a second time to match " last" and
    // try to match "two" against a substitution.  If "two" matches
    // the substitution, we have a successful parse.
    //
    // Since it's possible in many cases to find multiple instances
    // of each of these pieces of rule text in the input string,
    // we need to try all the possible combinations of these
    // locations.  This prevents us from prematurely declaring a mismatch,
    // and makes sure we match as much input text as we can.
    int highWaterMark = 0;
    double result = 0;
    int start = 0;
    double tempBaseValue = (double)(baseValue <= 0 ? 0 : baseValue);

    UnicodeString temp;
    do {
        // our partial parse result starts out as this rule's base
        // value.  If it finds a successful match, matchToDelimiter()
        // will compose this in some way with what it gets back from
        // the substitution, giving us a new partial parse result
        pp.setIndex(0);

        temp.setTo(fRuleText, sub1Pos, sub2Pos - sub1Pos);
        double partialResult = matchToDelimiter(workText, start, tempBaseValue,
            temp, pp, sub1,
            nonNumericalExecutedRuleMask,
            upperBound);

        // if we got a successful match (or were trying to match a
        // null substitution), pp is now pointing at the first unmatched
        // character.  Take note of that, and try matchToDelimiter()
        // on the input text again
        if (pp.getIndex() != 0 || sub1 == NULL) {
            start = pp.getIndex();

            UnicodeString workText2;
            workText2.setTo(workText, pp.getIndex(), workText.length() - pp.getIndex());
            ParsePosition pp2;

            // the second matchToDelimiter() will compose our previous
            // partial result with whatever it gets back from its
            // substitution if there's a successful match, giving us
            // a real result
            temp.setTo(fRuleText, sub2Pos, fRuleText.length() - sub2Pos);
            partialResult = matchToDelimiter(workText2, 0, partialResult,
                temp, pp2, sub2,
                nonNumericalExecutedRuleMask,
                upperBound);

            // if we got a successful match on this second
            // matchToDelimiter() call, update the high-water mark
            // and result (if necessary)
            if (pp2.getIndex() != 0 || sub2 == NULL) {
                if (prefixLength + pp.getIndex() + pp2.getIndex() > highWaterMark) {
                    highWaterMark = prefixLength + pp.getIndex() + pp2.getIndex();
                    result = partialResult;
                }
            }
            else {
                // commented out because ParsePosition doesn't have error index in 1.1.x
                // restored for ICU4C port
                int32_t i_temp = pp2.getErrorIndex() + sub1Pos + pp.getIndex();
                if (i_temp> parsePosition.getErrorIndex()) {
                    parsePosition.setErrorIndex(i_temp);
                }
            }
        }
        else {
            // commented out because ParsePosition doesn't have error index in 1.1.x
            // restored for ICU4C port
            int32_t i_temp = sub1Pos + pp.getErrorIndex();
            if (i_temp > parsePosition.getErrorIndex()) {
                parsePosition.setErrorIndex(i_temp);
            }
        }
        // keep trying to match things until the outer matchToDelimiter()
        // call fails to make a match (each time, it picks up where it
        // left off the previous time)
    } while (sub1Pos != sub2Pos
        && pp.getIndex() > 0
        && pp.getIndex() < workText.length()
        && pp.getIndex() != start);

    // update the caller's ParsePosition with our high-water mark
    // (i.e., it now points at the first character this function
    // didn't match-- the ParsePosition is therefore unchanged if
    // we didn't match anything)
    parsePosition.setIndex(highWaterMark);
    // commented out because ParsePosition doesn't have error index in 1.1.x
    // restored for ICU4C port
    if (highWaterMark > 0) {
        parsePosition.setErrorIndex(0);
    }

    // this is a hack for one unusual condition: Normally, whether this
    // rule belong to a fraction rule set or not is handled by its
    // substitutions.  But if that rule HAS NO substitutions, then
    // we have to account for it here.  By definition, if the matching
    // rule in a fraction rule set has no substitutions, its numerator
    // is 1, and so the result is the reciprocal of its base value.
    if (isFractionRule && highWaterMark > 0 && sub1 == NULL) {
        result = 1 / result;
    }

    resVal.setDouble(result);
    return TRUE; // ??? do we need to worry if it is a long or a double?
}